

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O3

void blend_a64_mask_sx_w4_sse4_1
               (uint8_t *dst,uint32_t dst_stride,uint8_t *src0,uint32_t src0_stride,uint8_t *src1,
               uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h)

{
  undefined4 uVar1;
  undefined4 uVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar18 [16];
  
  auVar8 = _DAT_0050dbc0;
  auVar7 = _DAT_0050dbb0;
  do {
    auVar9._8_8_ = 0;
    auVar9._0_8_ = *(ulong *)mask;
    auVar9 = pshufb(auVar9,auVar8);
    auVar10[0] = pavgb(auVar9[8],auVar9[0]);
    cVar11 = pavgb(auVar9[9],auVar9[1]);
    cVar12 = pavgb(auVar9[10],auVar9[2]);
    cVar13 = pavgb(auVar9[0xb],auVar9[3]);
    cVar14 = pavgb(auVar9[0xc],auVar9[4]);
    cVar15 = pavgb(auVar9[0xd],auVar9[5]);
    cVar16 = pavgb(auVar9[0xe],auVar9[6]);
    cVar17 = pavgb(auVar9[0xf],auVar9[7]);
    pavgb(auVar9[8],auVar9[0]);
    pavgb(auVar9[9],auVar9[1]);
    pavgb(auVar9[10],auVar9[2]);
    pavgb(auVar9[0xb],auVar9[3]);
    pavgb(auVar9[0xc],auVar9[4]);
    pavgb(auVar9[0xd],auVar9[5]);
    pavgb(auVar9[0xe],auVar9[6]);
    pavgb(auVar9[0xf],auVar9[7]);
    uVar1 = *(undefined4 *)src0;
    uVar2 = *(undefined4 *)src1;
    auVar18._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11((char)((uint)uVar2 >> 0x18),(char)((uint)uVar1 >> 0x18)),
                                 (char)((uint)uVar2 >> 0x10)),
                        CONCAT14((char)((uint)uVar1 >> 0x10),uVar1)) >> 0x20);
    auVar18[3] = (char)((uint)uVar2 >> 8);
    auVar18[2] = (char)((uint)uVar1 >> 8);
    auVar18[0] = (undefined1)uVar1;
    auVar18[1] = (char)uVar2;
    auVar18._8_8_ = 0;
    auVar10._8_8_ =
         (undefined8)
         (CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11(-cVar17,cVar17),-cVar16),
                                                       cVar16),-cVar15),cVar15),-cVar14),
                   CONCAT11(cVar14,cVar17)) >> 8);
    auVar10[7] = '@' - cVar13;
    auVar10[6] = cVar13;
    auVar10[5] = '@' - cVar12;
    auVar10[4] = cVar12;
    auVar10[3] = '@' - cVar11;
    auVar10[2] = cVar11;
    auVar10[1] = '@' - auVar10[0];
    auVar9 = pmaddubsw(auVar18,auVar10);
    auVar9 = pmulhrsw(auVar9,auVar7);
    sVar3 = auVar9._0_2_;
    sVar4 = auVar9._2_2_;
    sVar5 = auVar9._4_2_;
    sVar6 = auVar9._6_2_;
    *(uint *)dst = CONCAT13((0 < sVar6) * (sVar6 < 0x100) * auVar9[6] - (0xff < sVar6),
                            CONCAT12((0 < sVar5) * (sVar5 < 0x100) * auVar9[4] - (0xff < sVar5),
                                     CONCAT11((0 < sVar4) * (sVar4 < 0x100) * auVar9[2] -
                                              (0xff < sVar4),
                                              (0 < sVar3) * (sVar3 < 0x100) * auVar9[0] -
                                              (0xff < sVar3))));
    dst = dst + dst_stride;
    src0 = src0 + src0_stride;
    src1 = src1 + src1_stride;
    mask = (uint8_t *)((long)mask + (ulong)mask_stride);
    h = h + -1;
  } while (h != 0);
  return;
}

Assistant:

static void blend_a64_mask_sx_w4_sse4_1(
    uint8_t *dst, uint32_t dst_stride, const uint8_t *src0,
    uint32_t src0_stride, const uint8_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h) {
  (void)w;

  const __m128i v_shuffle_b = xx_loadu_128(g_blend_a64_mask_shuffle);
  const __m128i v_maxval_b = _mm_set1_epi8(AOM_BLEND_A64_MAX_ALPHA);
  const __m128i _r = _mm_set1_epi16(1 << (15 - AOM_BLEND_A64_ROUND_BITS));
  do {
    const __m128i v_r_b = xx_loadl_64(mask);
    const __m128i v_r0_s_b = _mm_shuffle_epi8(v_r_b, v_shuffle_b);
    const __m128i v_r_lo_b = _mm_unpacklo_epi64(v_r0_s_b, v_r0_s_b);
    const __m128i v_r_hi_b = _mm_unpackhi_epi64(v_r0_s_b, v_r0_s_b);
    const __m128i v_m0_b = _mm_avg_epu8(v_r_lo_b, v_r_hi_b);
    const __m128i v_m1_b = _mm_sub_epi8(v_maxval_b, v_m0_b);

    const __m128i v_res_b = blend_4_u8(src0, src1, &v_m0_b, &v_m1_b, &_r);
    xx_storel_32(dst, v_res_b);

    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
    mask += mask_stride;
  } while (--h);
}